

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

string * vkt::image::anon_unknown_2::getAtomicFuncArgumentShaderStr
                   (string *__return_storage_ptr__,AtomicOperation op,string *x,string *y,string *z,
                   IVec3 *gridSize)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (op < ATOMIC_OPERATION_EXCHANGE) {
    std::operator+(&local_70,"(",x);
    std::operator+(&local_178,&local_70,"*");
    std::operator+(&local_50,&local_178,x);
    std::operator+(&local_158,&local_50," + ");
    std::operator+(&local_138,&local_158,y);
    std::operator+(&local_118,&local_138,"*");
    std::operator+(&local_f8,&local_118,y);
    std::operator+(&local_d8,&local_f8," + ");
    std::operator+(&local_b8,&local_d8,z);
    std::operator+(&local_98,&local_b8,"*");
    std::operator+(&bStack_198,&local_98,z);
    std::operator+(__return_storage_ptr__,&bStack_198,")");
    std::__cxx11::string::~string((string *)&bStack_198);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_178);
    this = &local_70;
  }
  else {
    if (op != ATOMIC_OPERATION_EXCHANGE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,(char *)0x0,(allocator<char> *)&bStack_198);
      return __return_storage_ptr__;
    }
    std::operator+(&local_50,"((",z);
    std::operator+(&local_158,&local_50,"*");
    local_74 = gridSize->m_data[0];
    de::toString<int>(&local_178,&local_74);
    std::operator+(&local_138,&local_158,&local_178);
    std::operator+(&local_118,&local_138," + ");
    std::operator+(&local_f8,&local_118,x);
    std::operator+(&local_d8,&local_f8,")*");
    local_78 = gridSize->m_data[1];
    de::toString<int>(&local_70,&local_78);
    std::operator+(&local_b8,&local_d8,&local_70);
    std::operator+(&local_98,&local_b8," + ");
    std::operator+(&bStack_198,&local_98,y);
    std::operator+(__return_storage_ptr__,&bStack_198,")");
    std::__cxx11::string::~string((string *)&bStack_198);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    this = &local_50;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

static string getAtomicFuncArgumentShaderStr (const AtomicOperation	op,
											  const string&			x,
											  const string&			y,
											  const string&			z,
											  const IVec3&			gridSize)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:
		case ATOMIC_OPERATION_MIN:
		case ATOMIC_OPERATION_MAX:
		case ATOMIC_OPERATION_AND:
		case ATOMIC_OPERATION_OR:
		case ATOMIC_OPERATION_XOR:
			return string("(" + x + "*" + x + " + " + y + "*" + y + " + " + z + "*" + z + ")");
		case ATOMIC_OPERATION_EXCHANGE:
			return string("((" + z + "*" + toString(gridSize.x()) + " + " + x + ")*" + toString(gridSize.y()) + " + " + y + ")");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}